

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3Fts5IndexQuery
              (Fts5Index *p,char *pToken,int nToken,int flags,Fts5Colset *pColset,
              Fts5IndexIter **ppIter)

{
  Fts5Config *pFVar1;
  int iVar2;
  Fts5Structure *pStruct_00;
  long lVar3;
  Fts5SegIter *pSeg;
  int bDesc;
  Fts5Structure *pStruct;
  int nChar;
  int iIdx;
  Fts5Buffer buf;
  Fts5Iter *pRet;
  Fts5Config *pConfig;
  Fts5IndexIter **ppIter_local;
  Fts5Colset *pColset_local;
  int flags_local;
  int nToken_local;
  char *pToken_local;
  Fts5Index *p_local;
  
  pFVar1 = p->pConfig;
  buf.n = 0;
  buf.nSpace = 0;
  memset(&nChar,0,0x10);
  iVar2 = sqlite3Fts5BufferSize(&p->rc,(Fts5Buffer *)&nChar,nToken + 1);
  if (iVar2 == 0) {
    pStruct._4_4_ = 0;
    if (nToken != 0) {
      memcpy(_nChar + 1,pToken,(long)nToken);
    }
    if ((flags & 1U) != 0) {
      iVar2 = fts5IndexCharlen(pToken,nToken);
      pStruct._4_4_ = 1;
      while ((pStruct._4_4_ <= pFVar1->nPrefix && (pFVar1->aPrefix[pStruct._4_4_ + -1] != iVar2))) {
        pStruct._4_4_ = pStruct._4_4_ + 1;
      }
    }
    if (pFVar1->nPrefix < pStruct._4_4_) {
      *_nChar = '0';
      fts5SetupPrefixIter(p,(uint)((flags & 2U) != 0),_nChar,nToken + 1,pColset,(Fts5Iter **)&buf.n)
      ;
      fts5IterSetOutputCb(&p->rc,(Fts5Iter *)buf._8_8_);
      if ((p->rc == 0) &&
         (lVar3 = buf._8_8_ + 0x60 + (ulong)*(ushort *)(*(long *)(buf._8_8_ + 0x58) + 4) * 0x78,
         *(long *)(lVar3 + 0x10) != 0)) {
        (**(code **)(buf._8_8_ + 0x38))(buf._8_8_,lVar3);
      }
    }
    else {
      pStruct_00 = fts5StructureRead(p);
      *_nChar = (char)pStruct._4_4_ + '0';
      if (pStruct_00 != (Fts5Structure *)0x0) {
        fts5MultiIterNew(p,pStruct_00,flags | 0x10,pColset,_nChar,nToken + 1,-1,0,
                         (Fts5Iter **)&buf.n);
        fts5StructureRelease(pStruct_00);
      }
    }
    if (p->rc != 0) {
      sqlite3Fts5IterClose((Fts5IndexIter *)buf._8_8_);
      buf.n = 0;
      buf.nSpace = 0;
      fts5CloseReader(p);
    }
    *ppIter = (Fts5IndexIter *)buf._8_8_;
    sqlite3Fts5BufferFree((Fts5Buffer *)&nChar);
  }
  iVar2 = fts5IndexReturn(p);
  return iVar2;
}

Assistant:

static int sqlite3Fts5IndexQuery(
  Fts5Index *p,                   /* FTS index to query */
  const char *pToken, int nToken, /* Token (or prefix) to query for */
  int flags,                      /* Mask of FTS5INDEX_QUERY_X flags */
  Fts5Colset *pColset,            /* Match these columns only */
  Fts5IndexIter **ppIter          /* OUT: New iterator object */
){
  Fts5Config *pConfig = p->pConfig;
  Fts5Iter *pRet = 0;
  Fts5Buffer buf = {0, 0, 0};

  /* If the QUERY_SCAN flag is set, all other flags must be clear. */
  assert( (flags & FTS5INDEX_QUERY_SCAN)==0 || flags==FTS5INDEX_QUERY_SCAN );

  if( sqlite3Fts5BufferSize(&p->rc, &buf, nToken+1)==0 ){
    int iIdx = 0;                 /* Index to search */
    if( nToken ) memcpy(&buf.p[1], pToken, nToken);

    /* Figure out which index to search and set iIdx accordingly. If this
    ** is a prefix query for which there is no prefix index, set iIdx to
    ** greater than pConfig->nPrefix to indicate that the query will be
    ** satisfied by scanning multiple terms in the main index.
    **
    ** If the QUERY_TEST_NOIDX flag was specified, then this must be a
    ** prefix-query. Instead of using a prefix-index (if one exists), 
    ** evaluate the prefix query using the main FTS index. This is used
    ** for internal sanity checking by the integrity-check in debug 
    ** mode only.  */
#ifdef SQLITE_DEBUG
    if( pConfig->bPrefixIndex==0 || (flags & FTS5INDEX_QUERY_TEST_NOIDX) ){
      assert( flags & FTS5INDEX_QUERY_PREFIX );
      iIdx = 1+pConfig->nPrefix;
    }else
#endif
    if( flags & FTS5INDEX_QUERY_PREFIX ){
      int nChar = fts5IndexCharlen(pToken, nToken);
      for(iIdx=1; iIdx<=pConfig->nPrefix; iIdx++){
        if( pConfig->aPrefix[iIdx-1]==nChar ) break;
      }
    }

    if( iIdx<=pConfig->nPrefix ){
      /* Straight index lookup */
      Fts5Structure *pStruct = fts5StructureRead(p);
      buf.p[0] = (u8)(FTS5_MAIN_PREFIX + iIdx);
      if( pStruct ){
        fts5MultiIterNew(p, pStruct, flags | FTS5INDEX_QUERY_SKIPEMPTY, 
            pColset, buf.p, nToken+1, -1, 0, &pRet
        );
        fts5StructureRelease(pStruct);
      }
    }else{
      /* Scan multiple terms in the main index */
      int bDesc = (flags & FTS5INDEX_QUERY_DESC)!=0;
      buf.p[0] = FTS5_MAIN_PREFIX;
      fts5SetupPrefixIter(p, bDesc, buf.p, nToken+1, pColset, &pRet);
      assert( p->rc!=SQLITE_OK || pRet->pColset==0 );
      fts5IterSetOutputCb(&p->rc, pRet);
      if( p->rc==SQLITE_OK ){
        Fts5SegIter *pSeg = &pRet->aSeg[pRet->aFirst[1].iFirst];
        if( pSeg->pLeaf ) pRet->xSetOutputs(pRet, pSeg);
      }
    }

    if( p->rc ){
      sqlite3Fts5IterClose((Fts5IndexIter*)pRet);
      pRet = 0;
      fts5CloseReader(p);
    }

    *ppIter = (Fts5IndexIter*)pRet;
    sqlite3Fts5BufferFree(&buf);
  }
  return fts5IndexReturn(p);
}